

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::find_child_by_attribute(xml_node *this,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *p;
  bool bVar1;
  char_t *dst;
  xml_attribute_struct *pxVar2;
  xml_node local_30;
  
  if (this->_root != (xml_node_struct *)0x0) {
    for (p = this->_root->first_child; p != (xml_node_struct *)0x0; p = p->next_sibling) {
      for (pxVar2 = p->first_attribute; pxVar2 != (xml_attribute_struct *)0x0;
          pxVar2 = pxVar2->next_attribute) {
        if ((pxVar2->name != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(attr_name,pxVar2->name), bVar1)) {
          dst = pxVar2->value;
          if (dst == (char_t *)0x0) {
            dst = "";
          }
          bVar1 = impl::anon_unknown_0::strequal(attr_value,dst);
          if (bVar1) {
            xml_node(&local_30,p);
            return (xml_node)local_30._root;
          }
        }
      }
    }
  }
  xml_node(&local_30);
  return (xml_node)local_30._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::find_child_by_attribute(const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
			{
				const char_t* aname = a->name;
				if (aname && impl::strequal(attr_name, aname))
				{
					const char_t* avalue = a->value;
					if (impl::strequal(attr_value, avalue ? avalue : PUGIXML_TEXT("")))
						return xml_node(i);
				}
			}

		return xml_node();
	}